

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_tools.h
# Opt level: O3

bool math::matrix_is_diagonal<double>(double *mat,int rows,int cols,double *epsilon)

{
  double dVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  if (0 < rows) {
    dVar1 = *epsilon;
    lVar3 = (long)cols;
    uVar4 = (ulong)(uint)cols;
    uVar5 = 0;
    uVar7 = 0;
    bVar9 = false;
    pdVar6 = mat;
    do {
      if (uVar7 != 0 && 0 < cols) {
        uVar8 = 1;
        do {
          if (0.0 < mat[(ulong)uVar5 + (uVar8 - 1)] - dVar1) {
            return bVar9;
          }
          if (mat[(ulong)uVar5 + (uVar8 - 1)] + dVar1 < 0.0) {
            return bVar9;
          }
        } while ((uVar8 < uVar7) && (bVar2 = (long)uVar8 < lVar3, uVar8 = uVar8 + 1, bVar2));
      }
      uVar7 = uVar7 + 1;
      if ((long)uVar7 < lVar3) {
        uVar8 = 1;
        do {
          if (0.0 < pdVar6[uVar8] - dVar1) {
            return bVar9;
          }
          if (pdVar6[uVar8] + dVar1 < 0.0) {
            return bVar9;
          }
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
      }
      bVar9 = (uint)rows <= uVar7;
      uVar5 = uVar5 + cols;
      pdVar6 = pdVar6 + lVar3 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar7 != (uint)rows);
  }
  return true;
}

Assistant:

bool
matrix_is_diagonal (T* const mat, int rows, int cols, T const& epsilon)
{
    for (int y = 0; y < rows; ++y)
    {
        for (int x = 0; x < y && x < cols; ++x)
            if (!MATH_EPSILON_EQ(T(0), mat[y * cols + x], epsilon))
                return false;
        for (int x = y + 1; x < cols; ++x)
            if (!MATH_EPSILON_EQ(T(0), mat[y * cols + x], epsilon))
                return false;
    }
    return true;
}